

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O2

void __thiscall ON_SimpleArray<ON_3dex>::Insert(ON_SimpleArray<ON_3dex> *this,int i,ON_3dex *x)

{
  ON_3dex *pOVar1;
  int iVar2;
  ON_3dex *memblock;
  uint uVar3;
  
  if (-1 < i) {
    uVar3 = this->m_count;
    if (i <= (int)uVar3) {
      memblock = x;
      if (uVar3 == this->m_capacity) {
        if (x < this->m_a + uVar3 && this->m_a <= x) {
          memblock = (ON_3dex *)onmalloc(0xc);
          iVar2 = x->j;
          memblock->i = x->i;
          memblock->j = iVar2;
          memblock->k = x->k;
        }
        iVar2 = NewCapacity(this);
        Reserve(this,(long)iVar2);
        uVar3 = this->m_count;
      }
      this->m_count = uVar3 + 1;
      Move(this,i + 1,i,uVar3 - i);
      pOVar1 = this->m_a;
      pOVar1[(uint)i].k = memblock->k;
      iVar2 = memblock->j;
      pOVar1 = pOVar1 + (uint)i;
      pOVar1->i = memblock->i;
      pOVar1->j = iVar2;
      if (memblock != x) {
        onfree(memblock);
        return;
      }
    }
  }
  return;
}

Assistant:

void ON_SimpleArray<T>::Insert( int i, const T& x ) 
{
  if( i >= 0 && i <= m_count ) 
  {
    const T* p = &x;
    if ( m_count == m_capacity ) 
    {
      if (&x >= m_a && &x < (m_a + m_capacity))
      {
        // x is in the block of memory about to be reallocated.
        void* temp = onmalloc(sizeof(T));
        memcpy(temp, p, sizeof(T));
        p = (T*)temp;
      }
      int newcapacity = NewCapacity();
      Reserve( newcapacity );
    }
	  m_count++;
    Move( i+1, i, m_count-1-i );
	  m_a[i] = *p;
    if (p != &x)
      onfree((void*)p);
  }
}